

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix
          (cmGlobalNinjaGenerator *this,string *path)

{
  string *psVar1;
  int iVar2;
  
  if (path->_M_string_length != 0) {
    if ((path->_M_dataplus)._M_p[path->_M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)path);
    }
    psVar1 = (string *)(this->OutputPathPrefix)._M_string_length;
    if (psVar1 <= (string *)path->_M_string_length) {
      iVar2 = std::__cxx11::string::compare
                        ((ulong)path,(long)path->_M_string_length - (long)psVar1,psVar1);
      if (iVar2 == 0) {
        std::__cxx11::string::resize
                  ((ulong)path,
                   (char)path->_M_string_length - (char)(this->OutputPathPrefix)._M_string_length);
        return;
      }
    }
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CloseCompileCommandsStream()
{
  if (this->CompileCommandsStream) {
    *this->CompileCommandsStream << "\n]";
    delete this->CompileCommandsStream;
    this->CompileCommandsStream = nullptr;
  }
}